

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host_strchr_internal.c
# Opt level: O3

int main(void)

{
  uint uVar1;
  char *pcVar2;
  size_t sVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  
  pcVar2 = host_strchr("[1:2:3]:4:5",0x3a);
  uVar1 = (int)pcVar2 - 0x102004;
  bVar6 = uVar1 != 7;
  if (bVar6) {
    printf("fail: %s(%s,%s)%s = %u, expected %u\n","host_strchr","\"[1:2:3]:4:5\"","\':\'","-str",
           (ulong)uVar1,7);
  }
  uVar4 = (uint)!bVar6;
  uVar5 = (uint)bVar6;
  pcVar2 = host_strrchr("[1:2:3]:4:5",0x3a);
  uVar1 = (int)pcVar2 - 0x102004;
  if (uVar1 == 9) {
    uVar4 = uVar4 + 1;
  }
  else {
    printf("fail: %s(%s,%s)%s = %u, expected %u\n","host_strrchr","\"[1:2:3]:4:5\"","\':\'","-str",
           (ulong)uVar1,9);
    uVar5 = uVar5 + 1;
  }
  sVar3 = host_strcspn("[1:2:3]:4:5","/:");
  if ((int)sVar3 == 7) {
    uVar4 = uVar4 + 1;
  }
  else {
    printf("fail: %s(%s,%s)%s = %u, expected %u\n","host_strcspn","\"[1:2:3]:4:5\"","\"/:\"","",
           sVar3 & 0xffffffff,7);
    uVar5 = uVar5 + 1;
  }
  pcVar2 = host_strchr("[1:2:3]",0x3a);
  if (pcVar2 == (char *)0x0) {
    uVar4 = uVar4 + 1;
  }
  else {
    printf("fail: %s(%s,%s)%s = %u, expected %u\n","host_strchr","\"[1:2:3]\"","\':\'","== NULL",0,1
          );
    uVar5 = uVar5 + 1;
  }
  pcVar2 = host_strrchr("[1:2:3]",0x3a);
  if (pcVar2 == (char *)0x0) {
    uVar4 = uVar4 + 1;
  }
  else {
    printf("fail: %s(%s,%s)%s = %u, expected %u\n","host_strrchr","\"[1:2:3]\"","\':\'","== NULL",0,
           1);
    uVar5 = uVar5 + 1;
  }
  sVar3 = host_strcspn("[1:2:3]","/:");
  if ((int)sVar3 == 7) {
    uVar4 = uVar4 + 1;
  }
  else {
    printf("fail: %s(%s,%s)%s = %u, expected %u\n","host_strcspn","\"[1:2:3]\"","\"/:\"","",
           sVar3 & 0xffffffff,7);
    uVar5 = uVar5 + 1;
  }
  sVar3 = host_strcspn("[1:2/3]","/:");
  if ((int)sVar3 == 4) {
    uVar4 = uVar4 + 1;
  }
  else {
    printf("fail: %s(%s,%s)%s = %u, expected %u\n","host_strcspn","\"[1:2/3]\"","\"/:\"","",
           sVar3 & 0xffffffff,4);
    uVar5 = uVar5 + 1;
  }
  sVar3 = host_strcspn("[1:2:3]/","/:");
  if ((int)sVar3 == 7) {
    uVar4 = uVar4 + 1;
  }
  else {
    printf("fail: %s(%s,%s)%s = %u, expected %u\n","host_strcspn","\"[1:2:3]/\"","\"/:\"","",
           sVar3 & 0xffffffff,7);
    uVar5 = uVar5 + 1;
  }
  printf("passed %d failed %d total %d\n",(ulong)uVar4,(ulong)uVar5,(ulong)(uVar4 + uVar5));
  return (uint)(uVar5 != 0);
}

Assistant:

int main(void)
{
    int passes = 0, fails = 0;

#define TEST1(func, string, arg2, suffix, result) do                    \
    {                                                                   \
        const char *str = string;                                       \
        unsigned ret = func(str, arg2) suffix;                          \
        if (ret == result) {                                            \
            passes++;                                                   \
        } else {                                                        \
            printf("fail: %s(%s,%s)%s = %u, expected %u\n",             \
                   #func, #string, #arg2, #suffix, ret,                 \
                   (unsigned)result);                                   \
            fails++;                                                    \
        }                                                               \
} while (0)

    TEST1(host_strchr, "[1:2:3]:4:5", ':', -str, 7);
    TEST1(host_strrchr, "[1:2:3]:4:5", ':', -str, 9);
    TEST1(host_strcspn, "[1:2:3]:4:5", "/:",, 7);
    TEST1(host_strchr, "[1:2:3]", ':', == NULL, 1);
    TEST1(host_strrchr, "[1:2:3]", ':', == NULL, 1);
    TEST1(host_strcspn, "[1:2:3]", "/:",, 7);
    TEST1(host_strcspn, "[1:2/3]", "/:",, 4);
    TEST1(host_strcspn, "[1:2:3]/", "/:",, 7);

    printf("passed %d failed %d total %d\n", passes, fails, passes+fails);
    return fails != 0 ? 1 : 0;
}